

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affix.c
# Opt level: O1

err_t affixPrint(int argc,char **argv)

{
  char *name;
  err_t eVar1;
  int iVar2;
  ulong in_RAX;
  size_t sVar3;
  ulong uVar4;
  uint uVar5;
  char *pcVar6;
  ulong uVar7;
  size_t count;
  ulong local_38;
  
  eVar1 = 0x25b;
  if (0xfffffffd < argc - 3U) {
    local_38 = in_RAX;
    if (argc == 2) {
      pcVar6 = *argv;
      sVar3 = strLen(pcVar6);
      if (sVar3 == 0) {
        return 0x25b;
      }
      if (*pcVar6 != '-') {
        return 0x25b;
      }
      pcVar6 = pcVar6 + 1;
      argv = argv + 1;
    }
    else {
      pcVar6 = (char *)0x0;
    }
    eVar1 = cmdFileValExist(1,argv);
    if (eVar1 == 0) {
      name = *argv;
      if (pcVar6 == (char *)0x0) {
        puts("prefixes");
        uVar7 = 0;
        eVar1 = cmdFilePrefixRead((octet *)0x0,&local_38,name,0);
        if (eVar1 == 0) {
          uVar7 = 0;
          sVar3 = 0;
          do {
            pcVar6 = "+%u";
            if (uVar7 == 0) {
              pcVar6 = "  length: %u";
            }
            printf(pcVar6,local_38 & 0xffffffff);
            sVar3 = sVar3 + local_38;
            uVar7 = uVar7 + 1;
            eVar1 = cmdFilePrefixRead((octet *)0x0,&local_38,name,sVar3);
          } while (eVar1 == 0);
        }
        pcVar6 = "\n  count:  %u\n";
        if (uVar7 == 0) {
          pcVar6 = "  count:  %u\n";
        }
        printf(pcVar6,uVar7 & 0xffffffff);
        puts("suffixes");
        eVar1 = cmdFileSuffixRead((octet *)0x0,&local_38,name,0);
        uVar4 = 0;
        if (eVar1 == 0) {
          uVar4 = 0;
          sVar3 = 0;
          do {
            pcVar6 = "+%u";
            if (uVar4 == 0) {
              pcVar6 = "  length: %u";
            }
            printf(pcVar6,local_38 & 0xffffffff);
            sVar3 = sVar3 + local_38;
            uVar4 = uVar4 + 1;
            eVar1 = cmdFileSuffixRead((octet *)0x0,&local_38,name,sVar3);
          } while (eVar1 == 0);
        }
        pcVar6 = "\n  count:  %u\n";
        if (uVar4 == 0) {
          pcVar6 = "  count:  %u\n";
        }
        printf(pcVar6,uVar4 & 0xffffffff);
        eVar1 = 0;
        if (uVar7 != 0 || uVar4 != 0) {
          puts("\\warning false positives are possible");
          eVar1 = 0;
        }
      }
      else {
        iVar2 = strCmp(pcVar6,"pc");
        if (iVar2 == 0) {
          eVar1 = cmdFilePrefixRead((octet *)0x0,&local_38,name,0);
          uVar5 = 0;
          if (eVar1 == 0) {
            sVar3 = 0;
            do {
              sVar3 = sVar3 + local_38;
              eVar1 = cmdFilePrefixRead((octet *)0x0,&local_38,name,sVar3);
              uVar5 = uVar5 + 1;
            } while (eVar1 == 0);
          }
        }
        else {
          iVar2 = strCmp(pcVar6,"sc");
          if (iVar2 != 0) {
            return 0x25b;
          }
          eVar1 = cmdFileSuffixRead((octet *)0x0,&local_38,name,0);
          uVar5 = 0;
          if (eVar1 == 0) {
            uVar5 = 0;
            sVar3 = 0;
            do {
              sVar3 = sVar3 + local_38;
              eVar1 = cmdFileSuffixRead((octet *)0x0,&local_38,name,sVar3);
              uVar5 = uVar5 + 1;
            } while (eVar1 == 0);
          }
        }
        printf("%u\n",(ulong)uVar5);
        eVar1 = 0;
      }
    }
  }
  return eVar1;
}

Assistant:

static err_t affixPrint(int argc, char* argv[])
{
	err_t code;
	const char* scope = 0;
	// обработать опции
	if (argc < 1 || argc > 2)
		return ERR_CMD_PARAMS;
	if (argc == 2)
	{
		scope = argv[0];
		if (strLen(scope) < 1 || scope[0] != '-')
			return ERR_CMD_PARAMS;
		++scope, --argc, ++argv;
	}
	// проверить наличие файла
	code = cmdFileValExist(1, argv);
	ERR_CALL_CHECK(code);
	// печатать
	return cmdAffixPrint(argv[0], scope);
}